

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLinOp::AnyInterpolationAmr
          (MLNodeLinOp *this,int famrlev,Any *a_fine,Any *a_crse,IntVect *nghost)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int j;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  Box fbx;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  this_00 = &Any::get<amrex::MultiFab>(a_fine)->super_FabArray<amrex::FArrayBox>;
  this_01 = &Any::get<amrex::MultiFab>(a_crse)->super_FabArray<amrex::FArrayBox>;
  uVar2 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  iVar1 = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [(long)famrlev + -1];
  if ((iVar1 != 2) && (iVar1 != 4)) {
    Assert_host("refratio == 2 || refratio == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                ,0x1ed,(char *)0x0);
  }
  MFIter::MFIter(&mfi,&this_00->super_FabArrayBase,true);
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      return;
    }
    MFIter::tilebox(&fbx,&mfi);
    Box::grow(&fbx,nghost);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,this_00,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,this_01,&mfi);
    if (iVar1 == 2) {
      for (uVar6 = 0; uVar7 = fbx.smallend.vect[2], uVar6 != uVar2; uVar6 = uVar6 + 1) {
        for (; (int)uVar7 <= fbx.bigend.vect[2]; uVar7 = uVar7 + 1) {
          iVar3 = (int)uVar7 >> 1;
          for (uVar13 = fbx.smallend.vect[1]; (int)uVar13 <= fbx.bigend.vect[1]; uVar13 = uVar13 + 1
              ) {
            iVar8 = ((int)uVar13 >> 1) - local_110.begin.y;
            lVar23 = local_110.jstride * iVar8;
            lVar18 = (iVar3 - local_110.begin.z) * local_110.kstride;
            lVar22 = local_110.nstride * uVar6;
            lVar19 = ((iVar3 + 1) - local_110.begin.z) * local_110.kstride;
            lVar21 = (iVar8 + 1) * local_110.jstride;
            for (uVar5 = (long)fbx.smallend.vect[0]; (long)uVar5 <= (long)fbx.bigend.vect[0];
                uVar5 = uVar5 + 1) {
              uVar9 = (uint)uVar5;
              iVar8 = (int)uVar9 >> 1;
              if ((uVar13 & uVar9 & uVar7 & 1) == 0) {
                if ((uVar13 & uVar7 & 1) == 0) {
                  iVar8 = iVar8 - local_110.begin.x;
                  lVar16 = (long)iVar8;
                  if ((uVar7 & uVar9 & 1) != 0) {
                    dVar24 = local_110.p[lVar23 + lVar16 + lVar18 + lVar22] +
                             local_110.p[lVar23 + lVar16 + lVar19 + lVar22];
                    lVar16 = lVar23 + (iVar8 + 1);
                    goto LAB_006e583c;
                  }
                  if ((uVar13 & uVar9 & 1) == 0) {
                    if ((uVar5 & 1) == 0) {
                      if ((uVar13 & 1) == 0) {
                        if ((uVar7 & 1) == 0) {
                          dVar24 = local_110.p
                                   [((long)((int)uVar13 >> 1) - (long)local_110.begin.y) *
                                    local_110.jstride +
                                    ((long)iVar3 - (long)local_110.begin.z) * local_110.kstride +
                                    lVar22 + lVar16];
                          goto LAB_006e5854;
                        }
                        dVar24 = local_110.p[lVar23 + lVar16 + lVar18 + lVar22] +
                                 local_110.p[lVar23 + lVar16 + lVar19 + lVar22];
                      }
                      else {
                        dVar24 = local_110.p[lVar23 + lVar18 + lVar22 + lVar16] +
                                 local_110.p[lVar21 + lVar18 + lVar22 + lVar16];
                      }
                    }
                    else {
                      dVar24 = local_110.p[lVar23 + lVar18 + lVar22 + lVar16] +
                               local_110.p[lVar23 + lVar18 + lVar22 + (iVar8 + 1)];
                    }
                    dVar24 = dVar24 * 0.5;
                    goto LAB_006e5854;
                  }
                  dVar24 = local_110.p[lVar23 + lVar18 + lVar22 + lVar16] +
                           local_110.p[lVar21 + lVar18 + lVar22 + lVar16] +
                           local_110.p[lVar23 + lVar18 + lVar22 + (iVar8 + 1)] +
                           local_110.p[lVar21 + lVar18 + lVar22 + (iVar8 + 1)];
                }
                else {
                  lVar16 = (long)(iVar8 - local_110.begin.x);
                  dVar24 = local_110.p[lVar23 + lVar16 + lVar18 + lVar22] +
                           local_110.p[lVar23 + lVar16 + lVar19 + lVar22];
                  lVar16 = lVar21 + lVar16;
LAB_006e583c:
                  dVar24 = dVar24 + (local_110.p + lVar16)[lVar18 + lVar22] +
                           (local_110.p + lVar16)[lVar19 + lVar22];
                }
                dVar24 = dVar24 * 0.25;
              }
              else {
                lVar16 = (long)(iVar8 - local_110.begin.x);
                lVar14 = (long)((iVar8 - local_110.begin.x) + 1);
                dVar24 = (local_110.p[lVar23 + lVar16 + lVar18 + lVar22] +
                          local_110.p[lVar23 + lVar16 + lVar19 + lVar22] +
                          local_110.p[lVar21 + lVar16 + lVar18 + lVar22] +
                          local_110.p[lVar21 + lVar16 + lVar19 + lVar22] +
                          local_110.p[lVar23 + lVar14 + lVar18 + lVar22] +
                          local_110.p[lVar23 + lVar14 + lVar19 + lVar22] +
                          local_110.p[lVar21 + lVar14 + lVar18 + lVar22] +
                         local_110.p[lVar21 + lVar14 + lVar19 + lVar22]) * 0.125;
              }
LAB_006e5854:
              local_d0.p
              [((long)(int)uVar13 - (long)local_d0.begin.y) * local_d0.jstride +
               ((long)(int)uVar7 - (long)local_d0.begin.z) * local_d0.kstride +
               local_d0.nstride * uVar6 + (uVar5 - (long)local_d0.begin.x)] = dVar24;
            }
          }
        }
      }
    }
    else {
      for (uVar6 = 0; uVar7 = fbx.smallend.vect[2], uVar6 != uVar2; uVar6 = uVar6 + 1) {
        for (; (int)uVar7 <= fbx.bigend.vect[2]; uVar7 = uVar7 + 1) {
          iVar3 = (int)uVar7 >> 2;
          uVar9 = uVar7 & 3;
          iVar8 = (iVar3 * 4 + 4) - uVar7;
          for (uVar13 = fbx.smallend.vect[1]; (int)uVar13 <= fbx.bigend.vect[1]; uVar13 = uVar13 + 1
              ) {
            iVar4 = (int)uVar13 >> 2;
            uVar17 = uVar13 & 3;
            lVar18 = (iVar4 - local_110.begin.y) * local_110.jstride;
            lVar19 = (iVar3 - local_110.begin.z) * local_110.kstride;
            lVar23 = local_110.nstride * uVar6;
            lVar21 = ((iVar3 + 1) - local_110.begin.z) * local_110.kstride;
            iVar10 = (iVar4 * 4 + 4) - uVar13;
            lVar22 = ((iVar4 + 1) - local_110.begin.y) * local_110.jstride;
            iVar4 = 4 - fbx.smallend.vect[0];
            for (uVar5 = (long)fbx.smallend.vect[0]; (long)uVar5 <= (long)fbx.bigend.vect[0];
                uVar5 = uVar5 + 1) {
              uVar20 = (uint)uVar5;
              iVar11 = (int)uVar20 >> 2;
              if (((uVar13 | uVar20 | uVar7) & 3) == 0) {
                dVar24 = local_110.p[lVar18 + lVar19 + lVar23 + (iVar11 - local_110.begin.x)];
              }
              else {
                if (((uVar13 | uVar20) & 3) == 0) {
                  dVar24 = local_110.p
                           [lVar18 + (long)(iVar11 - local_110.begin.x) + lVar21 + lVar23] *
                           (double)uVar9;
                  dVar25 = local_110.p
                           [lVar18 + (long)(iVar11 - local_110.begin.x) + lVar19 + lVar23] *
                           (double)iVar8;
                }
                else {
                  iVar15 = iVar11 - local_110.begin.x;
                  lVar16 = (long)iVar15;
                  if (((uVar7 | uVar20) & 3) == 0) {
                    dVar24 = local_110.p[lVar22 + lVar19 + lVar23 + lVar16] * (double)uVar17;
                    dVar25 = local_110.p[lVar18 + lVar19 + lVar23 + lVar16] * (double)iVar10;
                  }
                  else {
                    uVar20 = uVar20 & 3;
                    if (((uVar13 | uVar7) & 3) != 0) {
                      if ((uVar5 & 3) == 0) {
                        dVar24 = (local_110.p[lVar22 + lVar16 + lVar21 + lVar23] *
                                  (double)(uVar17 * uVar9) +
                                 local_110.p[lVar18 + lVar16 + lVar21 + lVar23] *
                                 (double)(int)(iVar10 * uVar9) +
                                 local_110.p[lVar18 + lVar16 + lVar19 + lVar23] *
                                 (double)(iVar10 * iVar8) +
                                 local_110.p[lVar22 + lVar16 + lVar19 + lVar23] *
                                 (double)(int)(uVar17 * iVar8)) * 0.0625;
                      }
                      else if (uVar17 == 0) {
                        iVar11 = iVar4 + iVar11 * 4;
                        dVar24 = ((double)(uVar20 * uVar9) *
                                  local_110.p[lVar18 + (long)(iVar15 + 1) + lVar21 + lVar23] +
                                 (double)(int)(iVar11 * uVar9) *
                                 local_110.p[lVar18 + lVar16 + lVar21 + lVar23] +
                                 (double)(iVar11 * iVar8) *
                                 local_110.p[lVar18 + lVar16 + lVar19 + lVar23] +
                                 (double)(int)(uVar20 * iVar8) *
                                 local_110.p[lVar18 + (long)(iVar15 + 1) + lVar19 + lVar23]) *
                                 0.0625;
                      }
                      else if (uVar9 == 0) {
                        iVar11 = iVar4 + iVar11 * 4;
                        dVar24 = ((double)(uVar20 * uVar17) *
                                  local_110.p[lVar22 + lVar19 + lVar23 + (iVar15 + 1)] +
                                 (double)(int)(iVar11 * uVar17) *
                                 local_110.p[lVar22 + lVar19 + lVar23 + lVar16] +
                                 (double)(iVar11 * iVar10) *
                                 local_110.p[lVar18 + lVar19 + lVar23 + lVar16] +
                                 (double)(int)(uVar20 * iVar10) *
                                 local_110.p[lVar18 + lVar19 + lVar23 + (iVar15 + 1)]) * 0.0625;
                      }
                      else {
                        iVar11 = iVar4 + iVar11 * 4;
                        iVar12 = iVar11 * iVar10;
                        lVar14 = (long)(iVar15 + 1);
                        iVar11 = iVar11 * uVar17;
                        dVar24 = ((double)(uVar20 * uVar17 * uVar9) *
                                  local_110.p[lVar22 + lVar14 + lVar21 + lVar23] +
                                 (double)(int)(iVar11 * uVar9) *
                                 local_110.p[lVar22 + lVar16 + lVar21 + lVar23] +
                                 (double)(int)(uVar20 * iVar10 * uVar9) *
                                 local_110.p[lVar18 + lVar14 + lVar21 + lVar23] +
                                 (double)(int)(iVar12 * uVar9) *
                                 local_110.p[lVar18 + lVar16 + lVar21 + lVar23] +
                                 (double)(int)(uVar20 * uVar17 * iVar8) *
                                 local_110.p[lVar22 + lVar14 + lVar19 + lVar23] +
                                 (double)(iVar11 * iVar8) *
                                 local_110.p[lVar22 + lVar16 + lVar19 + lVar23] +
                                 (double)(iVar12 * iVar8) *
                                 local_110.p[lVar18 + lVar16 + lVar19 + lVar23] +
                                 (double)(int)(uVar20 * iVar10 * iVar8) *
                                 local_110.p[lVar18 + lVar14 + lVar19 + lVar23]) * 0.015625;
                      }
                      goto LAB_006e5eb8;
                    }
                    dVar24 = (double)uVar20 * local_110.p[lVar18 + lVar19 + lVar23 + (iVar15 + 1)];
                    dVar25 = (double)(iVar4 + iVar11 * 4) *
                             local_110.p[lVar18 + lVar19 + lVar23 + lVar16];
                  }
                }
                dVar24 = (dVar25 + dVar24) * 0.25;
              }
LAB_006e5eb8:
              local_d0.p
              [((long)(int)uVar13 - (long)local_d0.begin.y) * local_d0.jstride +
               ((long)(int)uVar7 - (long)local_d0.begin.z) * local_d0.kstride +
               local_d0.nstride * uVar6 + (uVar5 - (long)local_d0.begin.x)] = dVar24;
              iVar4 = iVar4 + -1;
            }
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MLNodeLinOp::AnyInterpolationAmr (int famrlev, Any& a_fine, const Any& a_crse,
                                  IntVect const& nghost) const
{
    AMREX_ASSERT(a_fine.is<MultiFab>());
    MultiFab& fine = a_fine.get<MultiFab>();
    MultiFab const& crse = a_crse.get<MultiFab>();

    const int ncomp = getNComp();
    const int refratio = AMRRefRatio(famrlev-1);

    AMREX_ALWAYS_ASSERT(refratio == 2 || refratio == 4);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        Box fbx = mfi.tilebox();
        fbx.grow(nghost);
        Array4<Real> const& ffab = fine.array(mfi);
        Array4<Real const> const& cfab = crse.const_array(mfi);

        if (refratio == 2) {
            AMREX_HOST_DEVICE_FOR_4D ( fbx, ncomp, i, j, k, n,
            {
                mlmg_lin_nd_interp_r2(i,j,k,n,ffab,cfab);
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D ( fbx, ncomp, i, j, k, n,
            {
                mlmg_lin_nd_interp_r4(i,j,k,n,ffab,cfab);
            });
        }
    }
}